

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

void Gia_ManDumpTestsDelay(Vec_Int_t *vTests,int nIter,char *pFileName,Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  Vec_Int_t *p_00;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  __stream = fopen(pFileName,"wb");
  iVar6 = p->vCis->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar4 = iVar6;
  }
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar3;
  iVar4 = vTests->nSize / nIter;
  if (vTests->nSize % nIter != 0) {
    __assert_fail("Vec_IntSize(vTests) % nIter == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x353,"void Gia_ManDumpTestsDelay(Vec_Int_t *, int, char *, Gia_Man_t *)");
  }
  if (iVar4 != p->nRegs + (iVar6 - p->nRegs) * 2) {
    __assert_fail("nVars == 2 * Gia_ManPiNum(p) + Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x354,"void Gia_ManDumpTestsDelay(Vec_Int_t *, int, char *, Gia_Man_t *)");
  }
  if (0 < nIter) {
    uVar2 = 0;
    uVar5 = 0;
    do {
      uVar7 = (ulong)uVar2;
      p_00->nSize = 0;
      iVar6 = p->nRegs;
      if (iVar6 < p->vCis->nSize) {
        iVar1 = iVar6 + uVar2;
        do {
          if ((iVar1 < 0) || (uVar8 = iVar6 + uVar2, vTests->nSize <= (int)uVar8))
          goto LAB_0053bbc1;
          fprintf(__stream,"%d",(ulong)(uint)vTests->pArray[uVar8]);
          if (vTests->nSize <= (int)uVar8) goto LAB_0053bbc1;
          Vec_IntPush(p_00,vTests->pArray[uVar8]);
          iVar6 = iVar6 + 1;
        } while (iVar6 < p->vCis->nSize);
        iVar6 = p->nRegs;
      }
      if (0 < iVar6) {
        lVar9 = 0;
        do {
          if (((int)uVar2 < 0) || (iVar6 = uVar2 + (int)lVar9, vTests->nSize <= iVar6))
          goto LAB_0053bbc1;
          fprintf(__stream,"%d",(ulong)(uint)vTests->pArray[uVar7]);
          if (vTests->nSize <= iVar6) goto LAB_0053bbc1;
          Vec_IntPush(p_00,vTests->pArray[uVar7]);
          lVar9 = lVar9 + 1;
          uVar7 = uVar7 + 1;
        } while (lVar9 < p->nRegs);
      }
      fputc(10,__stream);
      Gia_ManDumpTestsSimulate(p,p_00);
      iVar6 = p->vCis->nSize;
      if (iVar6 < iVar4) {
        iVar1 = iVar6 + uVar2;
        do {
          if ((iVar1 < 0) || (vTests->nSize <= (int)(iVar6 + uVar2))) {
LAB_0053bbc1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          fprintf(__stream,"%d",(ulong)(uint)vTests->pArray[iVar6 + uVar2]);
          iVar6 = iVar6 + 1;
        } while (iVar4 != iVar6);
      }
      iVar6 = p_00->nSize;
      if (0 < (long)iVar6) {
        piVar3 = p_00->pArray;
        lVar9 = 0;
        do {
          fprintf(__stream,"%d",(ulong)(uint)piVar3[lVar9]);
          lVar9 = lVar9 + 1;
        } while (iVar6 != lVar9);
      }
      fputc(10,__stream);
      uVar5 = uVar5 + 1;
      uVar2 = uVar2 + iVar4;
    } while (uVar5 != (uint)nIter);
  }
  Gia_ManCleanMark0(p);
  fclose(__stream);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return;
}

Assistant:

void Gia_ManDumpTestsDelay( Vec_Int_t * vTests, int nIter, char * pFileName, Gia_Man_t * p )
{
    FILE * pFile = fopen( pFileName, "wb" );
    Vec_Int_t * vValues = Vec_IntAlloc( Gia_ManCiNum(p) );
    int i, v, nVars = Vec_IntSize(vTests) / nIter;
    assert( Vec_IntSize(vTests) % nIter == 0 );
    assert( nVars == 2 * Gia_ManPiNum(p) + Gia_ManRegNum(p) );
    for ( i = 0; i < nIter; i++ )
    {
        // collect PIs followed by flops
        Vec_IntClear( vValues );
        for ( v = Gia_ManRegNum(p); v < Gia_ManCiNum(p); v++ )
        {
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
            Vec_IntPush( vValues, Vec_IntEntry(vTests, i * nVars + v) );
        }
        for ( v = 0; v < Gia_ManRegNum(p); v++ )
        {
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
            Vec_IntPush( vValues, Vec_IntEntry(vTests, i * nVars + v) );
        }
        fprintf( pFile, "\n" );
        // derive next-state values
        Gia_ManDumpTestsSimulate( p, vValues );
        // collect PIs followed by flops
        for ( v = Gia_ManCiNum(p); v < nVars; v++ )
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
        for ( v = 0; v < Vec_IntSize(vValues); v++ )
            fprintf( pFile, "%d", Vec_IntEntry(vValues, v) );
        fprintf( pFile, "\n" );
    }
    Gia_ManCleanMark0(p);
    fclose( pFile );
    Vec_IntFree( vValues );
}